

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# childgenerator.cpp
# Opt level: O2

string * __thiscall
ChildGenerator::handleFieldGeneration_abi_cxx11_
          (string *__return_storage_ptr__,ChildGenerator *this,int fieldIndex)

{
  bool bVar1;
  char *pcVar2;
  ChildGenerator *pCVar3;
  int *arg;
  int *arg_00;
  int *arg_01;
  int *arg_02;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ulong uVar5;
  string msgString;
  string elementString;
  string listIndexString;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  getFieldType_abi_cxx11_(&local_98,this,fieldIndex);
  bVar1 = std::operator==(&local_98,"single_value");
  if (bVar1) {
    std::operator+(&local_138,"    ",&this->parentName_);
    std::operator+(&local_158,&local_138,".add(");
    getFieldMsg_abi_cxx11_(&local_118,this,fieldIndex);
    std::operator+(&local_178,&local_158,&local_118);
    std::operator+(&local_198,&local_178,");\n\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_178);
    psVar4 = &local_118;
LAB_001160f3:
    std::__cxx11::string::~string((string *)psVar4);
    std::__cxx11::string::~string((string *)&local_158);
    this_00 = &local_138;
  }
  else {
    bVar1 = std::operator==(&local_98,"list");
    if (bVar1) {
      this->listIndex_ = this->listIndex_ + 1;
      boost::lexical_cast<std::__cxx11::string,int>(&local_198,(boost *)&this->listIndex_,arg);
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      psVar4 = &this->parentName_;
      std::operator+(&local_f8,"    Bottle& ",psVar4);
      std::operator+(&local_118,&local_f8,"_");
      std::operator+(&local_138,&local_118,&local_d8);
      std::operator+(&local_158,&local_138," = ");
      std::operator+(&local_178,&local_158,psVar4);
      std::operator+(&local_198,&local_178,".addList();\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      local_78 = psVar4;
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_f8);
      getFieldMsg_abi_cxx11_(&local_198,this,fieldIndex);
      uVar5 = 0;
      while (uVar5 < local_198._M_string_length) {
        pcVar2 = (char *)std::__cxx11::string::at((ulong)&local_198);
        if ((*pcVar2 == ',') || (uVar5 == local_198._M_string_length - 1)) {
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          local_178._M_string_length = 0;
          local_178.field_2._M_local_buf[0] = '\0';
          if (uVar5 == local_198._M_string_length - 1) {
            std::__cxx11::string::substr((ulong)&local_158,(ulong)&local_198);
          }
          else {
            std::__cxx11::string::substr((ulong)&local_158,(ulong)&local_198);
          }
          std::__cxx11::string::operator=((string *)&local_178,(string *)&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          boost::algorithm::erase_all<std::__cxx11::string,char[2]>
                    (&local_178,(char (*) [2])0x118e4d);
          std::operator+(&local_50,"    ",local_78);
          std::operator+(&local_b8,&local_50,"_");
          std::operator+(&local_f8,&local_b8,&local_d8);
          std::operator+(&local_118,&local_f8,".add(");
          std::operator+(&local_138,&local_118,&local_178);
          std::operator+(&local_158,&local_138,");\n");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_50);
          uVar5 = uVar5 + 1;
          std::__cxx11::string::~string((string *)&local_178);
        }
        else {
          uVar5 = uVar5 + 1;
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      this_00 = &local_198;
    }
    else {
      bVar1 = std::operator==(&local_98,"timestamp");
      if (bVar1) {
        this->listIndex_ = this->listIndex_ + 1;
        boost::lexical_cast<std::__cxx11::string,int>(&local_198,(boost *)&this->listIndex_,arg_00);
        std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_198);
        std::__cxx11::string::~string((string *)&local_198);
        if (this->toRos_ == true) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          psVar4 = &this->parentName_;
          std::operator+(&local_f8,"    Bottle& ",psVar4);
          std::operator+(&local_118,&local_f8,"_");
          std::operator+(&local_138,&local_118,&local_d8);
          std::operator+(&local_158,&local_138," = ");
          std::operator+(&local_178,&local_158,psVar4);
          std::operator+(&local_198,&local_178,".addList();\n");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&local_f8);
          std::operator+(&local_138,"    ",psVar4);
          std::operator+(&local_158,&local_138,"_");
          std::operator+(&local_178,&local_158,&local_d8);
          std::operator+(&local_198,&local_178,".add((int)timestamp);\n");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_138);
          std::operator+(&local_138,"    ",psVar4);
          std::operator+(&local_158,&local_138,"_");
          std::operator+(&local_178,&local_158,&local_d8);
          std::operator+(&local_198,&local_178,".add((int)round(frac*pow(10,9)));\n\n");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        else {
          psVar4 = &this->parentName_;
          std::operator+(&local_f8,"    Bottle& ",psVar4);
          std::operator+(&local_118,&local_f8,"_");
          std::operator+(&local_138,&local_118,&local_d8);
          std::operator+(&local_158,&local_138," = ");
          std::operator+(&local_178,&local_158,psVar4);
          std::operator+(&local_198,&local_178,".addList();\n");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&local_f8);
          std::operator+(&local_138,"    ",psVar4);
          std::operator+(&local_158,&local_138,"_");
          std::operator+(&local_178,&local_158,&local_d8);
          std::operator+(&local_198,&local_178,".add(counter);\n");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_138);
          std::operator+(&local_138,"    ",psVar4);
          std::operator+(&local_158,&local_138,"_");
          std::operator+(&local_178,&local_158,&local_d8);
          std::operator+(&local_198,&local_178,".add(timestamp);\n");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        std::__cxx11::string::~string((string *)&local_198);
        psVar4 = &local_178;
        goto LAB_001160f3;
      }
      bVar1 = std::operator==(&local_98,"counter");
      if (!bVar1) {
        bVar1 = std::operator==(&local_98,"mux");
        if (bVar1) {
          this->listIndex_ = this->listIndex_ + 1;
          boost::lexical_cast<std::__cxx11::string,int>
                    (&local_198,(boost *)&this->listIndex_,arg_01);
          std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_198);
          std::__cxx11::string::~string((string *)&local_198);
          if (this->toRos_ == true) {
            psVar4 = &this->parentName_;
            std::operator+(&local_f8,"    Bottle& ",psVar4);
            std::operator+(&local_118,&local_f8,"_");
            std::operator+(&local_138,&local_118,&local_d8);
            std::operator+(&local_158,&local_138," = ");
            std::operator+(&local_178,&local_158,psVar4);
            std::operator+(&local_198,&local_178,".addList();\n\n");
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&local_198);
            std::__cxx11::string::~string((string *)&local_178);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)&local_138);
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::~string((string *)&local_f8);
            getFieldMux_abi_cxx11_(&local_158,this,fieldIndex);
            std::operator+(&local_178,"    for(int i = 0; i < ",&local_158);
            std::operator+(&local_198,&local_178,".size(); i++) {\n");
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&local_198);
            std::__cxx11::string::~string((string *)&local_178);
            std::__cxx11::string::~string((string *)&local_158);
            std::operator+(&local_f8,"      ",psVar4);
            std::operator+(&local_118,&local_f8,"_");
            std::operator+(&local_138,&local_118,&local_d8);
            std::operator+(&local_158,&local_138,".add(");
            getFieldMux_abi_cxx11_(&local_b8,this,fieldIndex);
            std::operator+(&local_178,&local_158,&local_b8);
            std::operator+(&local_198,&local_178,".get(i));\n");
            std::__cxx11::string::append((string *)__return_storage_ptr__);
          }
          else {
            getFieldMux_abi_cxx11_(&local_158,this,fieldIndex);
            std::operator+(&local_178,"    for(int i = 0; i < ",&local_158);
            std::operator+(&local_198,&local_178,".size(); i++) {\n");
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&local_198);
            std::__cxx11::string::~string((string *)&local_178);
            std::__cxx11::string::~string((string *)&local_158);
            std::operator+(&local_f8,"      ",&this->parentName_);
            std::operator+(&local_118,&local_f8,"_");
            std::operator+(&local_138,&local_118,&local_d8);
            std::operator+(&local_158,&local_138,".add(");
            getFieldMux_abi_cxx11_(&local_b8,this,fieldIndex);
            std::operator+(&local_178,&local_158,&local_b8);
            std::operator+(&local_198,&local_178,".get(i));\n");
            std::__cxx11::string::append((string *)__return_storage_ptr__);
          }
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          bVar1 = std::operator==(&local_98,"msg");
          if (bVar1) {
            this->listIndex_ = this->listIndex_ + 1;
            boost::lexical_cast<std::__cxx11::string,int>
                      (&local_198,(boost *)&this->listIndex_,arg_02);
            std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_198);
            std::__cxx11::string::~string((string *)&local_198);
            psVar4 = &this->parentName_;
            std::operator+(&local_f8,"    Bottle& ",psVar4);
            std::operator+(&local_118,&local_f8,"_");
            std::operator+(&local_138,&local_118,&local_d8);
            std::operator+(&local_158,&local_138," = ");
            std::operator+(&local_178,&local_158,psVar4);
            std::operator+(&local_198,&local_178,".addList();\n\n");
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&local_198);
            std::__cxx11::string::~string((string *)&local_178);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)&local_138);
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::~string((string *)&local_f8);
            pCVar3 = getFirstChild(this);
            std::operator+(&local_198,psVar4,"_");
            std::operator+(&local_70,&local_198,&local_d8);
            std::__cxx11::string::_M_assign((string *)&pCVar3->parentName_);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_198);
            pCVar3 = getFirstChild(this);
            (**(pCVar3->super_YarpCodeGenerator)._vptr_YarpCodeGenerator)(&local_198,pCVar3);
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&local_198);
            removeFirstChild(this);
          }
        }
        goto LAB_001166db;
      }
      std::operator+(&local_178,"    ",&this->parentName_);
      std::operator+(&local_198,&local_178,".add(counter);\n\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_198);
      this_00 = &local_178;
    }
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_001166db:
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  return __return_storage_ptr__;
}

Assistant:

std::string ChildGenerator::handleFieldGeneration(int fieldIndex) {
  std::string code;

  std::string listIndexString;

  std::string type = getFieldType(fieldIndex);

  if(type == "single_value") {
    code += "    " + parentName_ + ".add(" + getFieldMsg(fieldIndex) + ");\n\n";
  } else if(type == "list") {
      listIndex_++;
      listIndexString = boost::lexical_cast<std::string>(listIndex_);
      code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n";
      int elementIndex = 0;
      std::string msgString = getFieldMsg(fieldIndex);
      for(int i = 0; i < msgString.size(); i++) {
        if(msgString.at(i) == ',' || i == (msgString.size() - 1)) {
          std::string elementString;
          if(i == (msgString.size() - 1))
            elementString = msgString.substr(elementIndex, ((i - elementIndex) + 1));
          else
            elementString = msgString.substr(elementIndex, (i - elementIndex));
          boost::erase_all(elementString, " ");
          code += "    " + parentName_ + "_" + listIndexString + ".add(" + elementString + ");\n";
          elementIndex = i + 1;
        }
      }
      code += "\n";
    } else if(type == "timestamp") {
        listIndex_++;
        listIndexString = boost::lexical_cast<std::string>(listIndex_);
        if (toRos_){
            code += "    double dummy;\n";
            code += "    double frac=modf(timestamp,&dummy);\n";
            code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n";
            code += "    " + parentName_ + "_" + listIndexString + ".add((int)timestamp);\n";
            code += "    " + parentName_ + "_" + listIndexString + ".add((int)round(frac*pow(10,9)));\n\n";
        }
        else {
            code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n";
            code += "    " + parentName_ + "_" + listIndexString + ".add(counter);\n";
            code += "    " + parentName_ + "_" + listIndexString + ".add(timestamp);\n";
        }
      } else if(type == "counter") {
          code += "    " + parentName_ + ".add(counter);\n\n";
        } else if(type == "mux") {
            listIndex_++;
            listIndexString = boost::lexical_cast<std::string>(listIndex_);
            if (toRos_)
            {
                code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n\n";
                code += "    for(int i = 0; i < " + getFieldMux(fieldIndex) + ".size(); i++) {\n";
                code += "      " + parentName_ + "_" + listIndexString + ".add(" + getFieldMux(fieldIndex) + ".get(i));\n";
                code += "    }\n\n";
            }
            else {
                code += "    for(int i = 0; i < " + getFieldMux(fieldIndex) + ".size(); i++) {\n";
                code += "      " + parentName_ + "_" + listIndexString + ".add(" + getFieldMux(fieldIndex) + ".get(i));\n";
                code += "    }\n\n";
            }

          } else if(type == "msg") {
              listIndex_++;
              listIndexString = boost::lexical_cast<std::string>(listIndex_);
              code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n\n";
              getFirstChild().setParentName(parentName_ + "_" + listIndexString);
              code += getFirstChild().generateCode();
              removeFirstChild();
            }

  return code;
}